

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O3

void __thiscall CGV::CGV(CGV *this,ASTNode *root,SymbolTable *_symbolTable)

{
  CodeWriter *this_00;
  ASTNode *pAVar1;
  
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR_visit_0014cc30;
  (this->output)._M_dataplus._M_p = (pointer)&(this->output).field_2;
  (this->output)._M_string_length = 0;
  (this->output).field_2._M_local_buf[0] = '\0';
  (this->currentNamespace)._M_dataplus._M_p = (pointer)&(this->currentNamespace).field_2;
  (this->currentNamespace)._M_string_length = 0;
  (this->currentNamespace).field_2._M_local_buf[0] = '\0';
  (this->currentFuncName)._M_dataplus._M_p = (pointer)&(this->currentFuncName).field_2;
  (this->currentFuncName)._M_string_length = 0;
  (this->currentFuncName).field_2._M_local_buf[0] = '\0';
  this->symbolTable = _symbolTable;
  this_00 = (CodeWriter *)operator_new(0x178);
  memset(this_00,0,0x178);
  CodeWriter::CodeWriter(this_00);
  this->writer = this_00;
  pAVar1 = AST::ASTNode::getChild(root,0);
  (**pAVar1->_vptr_ASTNode)(pAVar1,this);
  return;
}

Assistant:

CGV::CGV(AST::ASTNode *root, Semantic::SymbolTable *_symbolTable) {
    this->symbolTable = _symbolTable;
    this->writer = new CodeWriter();
    root->getChild(0)->accept(*this);
}